

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

MeasuredBRDF * pbrt::MeasuredBxDF::BRDFDataFromFile(string *filename,Allocator alloc)

{
  int iVar1;
  iterator iVar2;
  MeasuredBRDF *pMVar3;
  mapped_type *ppMVar4;
  
  if (BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::
      loadedData_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                                 ::loadedData_abi_cxx11_);
    if (iVar1 != 0) {
      BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::
      loadedData_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::
      loadedData_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::
      loadedData_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
            ::loadedData_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::
      loadedData_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
            ::loadedData_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::
      loadedData_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>_>_>
                   ::~map,&BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                           ::loadedData_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                           ::loadedData_abi_cxx11_);
    }
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>_>_>
          ::find(&BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                  ::loadedData_abi_cxx11_._M_t,filename);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::
       loadedData_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    pMVar3 = MeasuredBRDF::Create(filename,alloc);
    ppMVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>_>_>
              ::operator[](&BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                            ::loadedData_abi_cxx11_,filename);
    *ppMVar4 = pMVar3;
  }
  ppMVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>_>_>
            ::operator[](&BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                          ::loadedData_abi_cxx11_,filename);
  return *ppMVar4;
}

Assistant:

MeasuredBRDF *MeasuredBxDF::BRDFDataFromFile(const std::string &filename,
                                             Allocator alloc) {
    static std::map<std::string, MeasuredBRDF *> loadedData;
    if (loadedData.find(filename) == loadedData.end())
        loadedData[filename] = MeasuredBRDF::Create(filename, alloc);
    return loadedData[filename];
}